

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::nextDocument(Input *this)

{
  bool bVar1;
  pointer this_00;
  document_iterator local_20;
  document_iterator local_18;
  Input *local_10;
  Input *this_local;
  
  local_10 = this;
  local_18 = document_iterator::operator++(&this->DocIterator);
  this_00 = std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::
            operator->(&this->Strm);
  local_20 = yaml::Stream::end(this_00);
  bVar1 = document_iterator::operator!=(&local_18,&local_20);
  return bVar1;
}

Assistant:

bool Input::nextDocument() {
  return ++DocIterator != Strm->end();
}